

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

uint __thiscall pstore::database::get_current_revision(database *this)

{
  uint uVar1;
  element_type *peVar2;
  atomic<unsigned_int> *paVar3;
  undefined1 local_38 [24];
  database *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_38._16_8_ = this;
  get_footer((database *)local_38);
  peVar2 = std::__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  paVar3 = &(peVar2->a).generation;
  local_14 = 5;
  ___b = (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
         (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)paVar3;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_14 - 1U < 2) {
    this_local._4_4_ = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  else if (local_14 == 5) {
    this_local._4_4_ = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  else {
    this_local._4_4_ = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  uVar1 = this_local._4_4_;
  std::shared_ptr<const_pstore::trailer>::~shared_ptr((shared_ptr<const_pstore::trailer> *)local_38)
  ;
  return uVar1;
}

Assistant:

unsigned get_current_revision () const { return get_footer ()->a.generation.load (); }